

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_debug(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *in_RDI;
  char buffer [250];
  int idx;
  lua_State *L_00;
  GCRef in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  lua_State *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff14;
  MRef in_stack_ffffffffffffff18;
  MRef in_stack_ffffffffffffff1c;
  lua_State *in_stack_ffffffffffffff20;
  
  while( true ) {
    fputs("lua_debug> ",_stderr);
    pcVar2 = fgets(&stack0xfffffffffffffef8,0xfa,_stdin);
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(&stack0xfffffffffffffef8,"cont\n");
    if (iVar1 == 0) break;
    L_00 = (lua_State *)&stack0xfffffffffffffef8;
    pcVar2 = in_RDI;
    strlen(&stack0xfffffffffffffef8);
    iVar1 = luaL_loadbuffer(in_stack_ffffffffffffff00,
                            (char *)CONCAT44(in_stack_fffffffffffffefc,
                                             in_stack_fffffffffffffef8.gcptr32),(size_t)L_00,pcVar2)
    ;
    idx = (int)((ulong)pcVar2 >> 0x20);
    if ((iVar1 != 0) ||
       (iVar1 = lua_pcall(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c.ptr32,
                          in_stack_ffffffffffffff18.ptr32,in_stack_ffffffffffffff14), iVar1 != 0)) {
      pcVar2 = lua_tolstring(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,(size_t *)L_00);
      fputs(pcVar2,_stderr);
      fputs("\n",_stderr);
    }
    lua_settop(L_00,idx);
  }
  return 0;
}

Assistant:

LJLIB_CF(debug_debug)
{
  for (;;) {
    char buffer[250];
    fputs("lua_debug> ", stderr);
    if (fgets(buffer, sizeof(buffer), stdin) == 0 ||
	strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
	lua_pcall(L, 0, 0, 0)) {
      fputs(lua_tostring(L, -1), stderr);
      fputs("\n", stderr);
    }
    lua_settop(L, 0);  /* remove eventual returns */
  }
}